

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

ServiceOptions * __thiscall
google::protobuf::anon_unknown_24::
FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
::AllocateArray<google::protobuf::ServiceOptions>
          (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           *this,int array_size)

{
  bool bVar1;
  int v1;
  int v2;
  IntT<google::protobuf::ServiceOptions> *pIVar2;
  char *failure_msg;
  LogMessage *pLVar3;
  LogMessage local_68;
  Voidify local_51;
  Nullable<const_char_*> local_50;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  ServiceOptions *res;
  int *used;
  TypeToUse **data;
  LogMessage local_28;
  Voidify local_16;
  undefined1 local_15;
  int local_14;
  bool trivial;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *pFStack_10;
  int array_size_local;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *this_local;
  
  local_15 = 0;
  local_14 = array_size;
  pFStack_10 = this;
  bVar1 = has_allocated(this);
  data._7_1_ = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x1b0,"has_allocated()");
    data._7_1_ = 1;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_16,pLVar3);
  }
  if ((data._7_1_ & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_28);
  }
  used = (int *)TypeMap<google::protobuf::(anonymous_namespace)::PointerT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::Get<google::protobuf::ServiceOptions>(&this->pointers_);
  res = (ServiceOptions *)
        TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
        ::Get<google::protobuf::ServiceOptions>(&this->used_);
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)
       (*(long *)used +
       (long)*(int *)&(res->super_Message).super_MessageLite._vptr_MessageLite * 0x58);
  *(int *)&(res->super_Message).super_MessageLite._vptr_MessageLite =
       *(int *)&(res->super_Message).super_MessageLite._vptr_MessageLite + local_14;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue
                 (*(int *)&(res->super_Message).super_MessageLite._vptr_MessageLite);
  pIVar2 = TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ::Get<google::protobuf::ServiceOptions>(&this->total_);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue(*pIVar2);
  local_50 = absl::lts_20250127::log_internal::Check_LEImpl
                       (v1,v2,"used <= total_.template Get<TypeToUse>()");
  if (local_50 == (Nullable<const_char_*>)0x0) {
    return (ServiceOptions *)absl_log_internal_check_op_result;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_50);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,0x1b6,failure_msg);
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_68);
}

Assistant:

U* AllocateArray(int array_size) {
    constexpr bool trivial = std::is_trivially_destructible<U>::value;
    using TypeToUse = typename std::conditional<trivial, char, U>::type;

    // We can only allocate after FinalizePlanning has been called.
    ABSL_CHECK(has_allocated());

    TypeToUse*& data = pointers_.template Get<TypeToUse>();
    int& used = used_.template Get<TypeToUse>();
    U* res = reinterpret_cast<U*>(data + used);
    used += trivial ? RoundUpTo<8>(array_size * sizeof(U)) : array_size;
    ABSL_CHECK_LE(used, total_.template Get<TypeToUse>());
    return res;
  }